

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.h
# Opt level: O2

VoidType * __thiscall psy::C::DeclarationBinder::makeType<psy::C::VoidType>(DeclarationBinder *this)

{
  tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_> this_00;
  Type *pTVar1;
  pointer __p;
  __uniq_ptr_impl<psy::C::Type,_std::default_delete<psy::C::Type>_> local_20;
  _Head_base<0UL,_psy::C::VoidType_*,_false> local_18;
  
  this_00.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
  super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>)operator_new(0x10);
  VoidType::VoidType((VoidType *)
                     this_00.
                     super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
                     super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl);
  local_18._M_head_impl = (VoidType *)0x0;
  local_20._M_t.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
  super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl =
       (tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
       (tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
       this_00.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
       super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl;
  pTVar1 = SemanticModel::keepType
                     (this->semaModel_,
                      (unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_> *)&local_20);
  if ((_Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
      local_20._M_t.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
      super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl != (Type *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>
                          .super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl + 8))();
  }
  local_20._M_t.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
  super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl =
       (tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
       (_Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>)0x0;
  std::unique_ptr<psy::C::VoidType,_std::default_delete<psy::C::VoidType>_>::~unique_ptr
            ((unique_ptr<psy::C::VoidType,_std::default_delete<psy::C::VoidType>_> *)&local_18);
  return (VoidType *)pTVar1;
}

Assistant:

TyT* DeclarationBinder::makeType(TyTArgs... args)
{
    std::unique_ptr<TyT> ty(new TyT(std::forward<TyTArgs>(args)...));
    return static_cast<TyT*>(semaModel_->keepType(std::move(ty)));
}